

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_linetype.cpp
# Opt level: O0

bool __thiscall ON_Linetype::SetSegment(ON_Linetype *this,int index,double length,eSegType type)

{
  bool bVar1;
  int iVar2;
  ON_LinetypeSegment *pOVar3;
  eSegType type_local;
  double length_local;
  int index_local;
  ON_Linetype *this_local;
  
  bVar1 = PatternIsLocked(this);
  if (((!bVar1) && (-1 < index)) &&
     (iVar2 = ON_SimpleArray<ON_LinetypeSegment>::Count(&this->m_private->m_segments), index < iVar2
     )) {
    pOVar3 = ON_SimpleArray<ON_LinetypeSegment>::operator[](&this->m_private->m_segments,index);
    pOVar3->m_length = length;
    pOVar3 = ON_SimpleArray<ON_LinetypeSegment>::operator[](&this->m_private->m_segments,index);
    pOVar3->m_seg_type = type;
    return true;
  }
  return false;
}

Assistant:

bool ON_Linetype::SetSegment( int index, double length, ON_LinetypeSegment::eSegType type)
{
  if (PatternIsLocked())
    return false;

  if( index >= 0 && index < m_private->m_segments.Count())
  {
    m_private->m_segments[index].m_length = length;
    m_private->m_segments[index].m_seg_type = type;
    return true;
  }
  else
    return false;
}